

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O2

int HTS_fgetc(HTS_File *fp)

{
  long *plVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  
  uVar4 = 0xffffffff;
  if (fp != (HTS_File *)0x0) {
    if (fp->type == '\x01') {
      plVar1 = (long *)fp->pointer;
      uVar2 = plVar1[2];
      if (uVar2 < (ulong)plVar1[1]) {
        plVar1[2] = uVar2 + 1;
        uVar4 = (uint)*(byte *)(*plVar1 + uVar2);
      }
    }
    else {
      if (fp->type == '\0') {
        iVar3 = fgetc((FILE *)fp->pointer);
        return iVar3;
      }
      HTS_error(0,"HTS_fgetc: Unknown file type.\n");
    }
  }
  return uVar4;
}

Assistant:

int HTS_fgetc(HTS_File * fp)
{
   if (fp == NULL) {
      return EOF;
   } else if (fp->type == HTS_FILE) {
      return fgetc((FILE *) fp->pointer);
   } else if (fp->type == HTS_DATA) {
      HTS_Data *d = (HTS_Data *) fp->pointer;
      if (d->size <= d->index)
         return EOF;
      return (int) d->data[d->index++];
   }
   HTS_error(0, "HTS_fgetc: Unknown file type.\n");
   return EOF;
}